

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O1

int uv__make_pipe(int *fds,int flags)

{
  int iVar1;
  int *piVar2;
  
  if (uv__make_pipe_no_pipe2 == '\0') {
    iVar1 = uv__pipe2(fds,flags | 0x80000);
    if (iVar1 == 0) {
      return 0;
    }
    piVar2 = __errno_location();
    if (*piVar2 != 0x26) {
      return -*piVar2;
    }
    uv__make_pipe_no_pipe2 = '\x01';
  }
  iVar1 = pipe(fds);
  if (iVar1 == 0) {
    uv__cloexec(*fds,1);
    uv__cloexec(fds[1],1);
    iVar1 = 0;
    if (((uint)flags >> 0xb & 1) != 0) {
      uv__nonblock(*fds,1);
      uv__nonblock(fds[1],1);
    }
  }
  else {
    piVar2 = __errno_location();
    iVar1 = -*piVar2;
  }
  return iVar1;
}

Assistant:

int uv__make_pipe(int fds[2], int flags) {
#if defined(__linux__)
  static int no_pipe2;

  if (no_pipe2)
    goto skip;

  if (uv__pipe2(fds, flags | UV__O_CLOEXEC) == 0)
    return 0;

  if (errno != ENOSYS)
    return -errno;

  no_pipe2 = 1;

skip:
#endif

  if (pipe(fds))
    return -errno;

  uv__cloexec(fds[0], 1);
  uv__cloexec(fds[1], 1);

  if (flags & UV__F_NONBLOCK) {
    uv__nonblock(fds[0], 1);
    uv__nonblock(fds[1], 1);
  }

  return 0;
}